

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMatrixSlice.h
# Opt level: O1

void __thiscall
HighsMatrixSlice<HighsTripletTreeSliceInOrder>::iterator::iterator
          (iterator *this,HighsInt *nodeIndex,double *nodeValue,HighsInt *nodeLeft,
          HighsInt *nodeRight,HighsInt node)

{
  vector<int,_std::allocator<int>_> *this_00;
  HighsInt *__args;
  double **ppdVar1;
  iterator iVar2;
  int iVar3;
  int local_24;
  
  (this->pos_).index_ = nodeIndex;
  (this->pos_).value_ = nodeValue;
  this->nodeLeft = nodeLeft;
  this->nodeRight = nodeRight;
  this_00 = &this->stack;
  (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->currentNode = node;
  std::vector<int,_std::allocator<int>_>::reserve(this_00,0x10);
  iVar2._M_current =
       (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_00,iVar2,&local_24);
  }
  else {
    *iVar2._M_current = -1;
    (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  __args = &this->currentNode;
  if (*__args != -1) {
    iVar3 = *__args;
    while (nodeLeft[iVar3] != -1) {
      iVar2._M_current =
           (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)this_00,iVar2,__args);
      }
      else {
        *iVar2._M_current = iVar3;
        (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
      iVar3 = nodeLeft[*__args];
      *__args = iVar3;
    }
    (this->pos_).index_ = (this->pos_).index_ + iVar3;
    ppdVar1 = &(this->pos_).value_;
    *ppdVar1 = *ppdVar1 + iVar3;
  }
  return;
}

Assistant:

iterator(const HighsInt* nodeIndex, const double* nodeValue,
             const HighsInt* nodeLeft, const HighsInt* nodeRight, HighsInt node)
        : pos_(nodeIndex, nodeValue),
          nodeLeft(nodeLeft),
          nodeRight(nodeRight),
          currentNode(node) {
      stack.reserve(16);
      stack.push_back(-1);
      if (currentNode == -1) return;
      while (nodeLeft[currentNode] != -1) {
        stack.push_back(currentNode);
        currentNode = nodeLeft[currentNode];
      }

      pos_.index_ += currentNode;
      pos_.value_ += currentNode;
    }